

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildExtensionRange
          (DescriptorBuilder *this,ExtensionRange *proto,Descriptor *parent,ExtensionRange *result)

{
  Descriptor *pDVar1;
  int32 iVar2;
  string *psVar3;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  ExtensionRange *local_28;
  ExtensionRange *result_local;
  Descriptor *parent_local;
  ExtensionRange *proto_local;
  DescriptorBuilder *this_local;
  
  local_28 = result;
  result_local = (ExtensionRange *)parent;
  parent_local = (Descriptor *)proto;
  proto_local = (ExtensionRange *)this;
  iVar2 = DescriptorProto_ExtensionRange::start(proto);
  local_28->start = iVar2;
  iVar2 = DescriptorProto_ExtensionRange::end((DescriptorProto_ExtensionRange *)parent_local);
  local_28->end = iVar2;
  if (local_28->start < 1) {
    psVar3 = Descriptor::full_name_abi_cxx11_((Descriptor *)result_local);
    pDVar1 = parent_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Extension numbers must be positive integers.",&local_49);
    AddError(this,psVar3,(Message *)pDVar1,NUMBER,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  if (local_28->end <= local_28->start) {
    psVar3 = Descriptor::full_name_abi_cxx11_((Descriptor *)result_local);
    pDVar1 = parent_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Extension range end number must be greater than start number.",
               &local_81);
    AddError(this,psVar3,(Message *)pDVar1,NUMBER,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildExtensionRange(
    const DescriptorProto::ExtensionRange& proto,
    const Descriptor* parent,
    Descriptor::ExtensionRange* result) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension numbers must be positive integers.");
  }

  // Checking of the upper bound of the extension range is deferred until after
  // options interpreting. This allows messages with message_set_wire_format to
  // have extensions beyond FieldDescriptor::kMaxNumber, since the extension
  // numbers are actually used as int32s in the message_set_wire_format.

  if (result->start >= result->end) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension range end number must be greater than start number.");
  }
}